

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::Image::palettize(Image *this,int32 depth)

{
  uint32 dstStride;
  uint uVar1;
  Node *pNVar2;
  uint8 *dstPixels;
  uint8 *__ptr;
  ColorQuant quant;
  RGBA colors [256];
  ColorQuant local_450;
  RGBA local_438 [258];
  
  local_450.leaves.link.next = &local_450.leaves.link;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1117"
  ;
  local_450.leaves.link.prev = local_450.leaves.link.next;
  pNVar2 = (Node *)(*DAT_00149de8)(0xb0);
  pNVar2->r = 0;
  pNVar2->g = 0;
  pNVar2->b = 0;
  pNVar2->a = 0;
  pNVar2->numPixels = 0;
  memset(&pNVar2->parent,0,0x98);
  local_450.root = pNVar2;
  ColorQuant::addImage(&local_450,this);
  ColorQuant::makePalette(&local_450,1 << ((byte)depth & 0x1f),local_438);
  dstStride = this->width;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 687"
  ;
  dstPixels = (uint8 *)(*DAT_00149de8)(this->height * dstStride,0x30018);
  __ptr = dstPixels;
  ColorQuant::matchImage(&local_450,dstPixels,dstStride,this);
  free(this,__ptr);
  uVar1 = (uint)depth >> 3;
  if (depth < 8) {
    uVar1 = 1;
  }
  this->depth = depth;
  this->bpp = uVar1;
  this->stride = dstStride;
  this->pixels = (uint8 *)0x0;
  this->palette = (uint8 *)0x0;
  this->pixels = dstPixels;
  *(byte *)&this->flags = (byte)this->flags | 1;
  allocate(this);
  memcpy(this->palette,local_438,(long)(4 << ((byte)depth & 0x1f)));
  ColorQuant::Node::destroy(local_450.root);
  return;
}

Assistant:

void
Image::palettize(int32 depth)
{
	RGBA colors[256];
	ColorQuant quant;
	uint8 *newpixels;
	uint32 newstride;

	quant.init();
	quant.addImage(this);
	assert(depth <= 8);
	quant.makePalette(1<<depth, colors);

	newstride = this->width;
	newpixels = rwNewT(uint8, newstride*this->height, MEMDUR_EVENT | ID_IMAGE);
	// TODO: maybe do floyd-steinberg dithering?
	quant.matchImage(newpixels, newstride, this);

	this->free();
	this->depth = depth;
	this->bpp = depth < 8 ? 1 : depth/8;
	this->stride = newstride;
	this->pixels = nil;
	this->palette = nil;
	this->setPixels(newpixels);
	this->allocate();
	memcpy(this->palette, colors, 4*(1<<depth));

	quant.destroy();
}